

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O0

pos_type __thiscall
zstr::istreambuf::seekoff(istreambuf *this,off_type off,seekdir dir,openmode which)

{
  pos_type pVar1;
  bool bVar2;
  pointer pzVar3;
  _Ios_Openmode in_EDX;
  long in_RSI;
  fpos<__mbstate_t> *in_RDI;
  pos_type pVar4;
  streamoff in_stack_ffffffffffffffc8;
  uLong __off;
  streamoff local_10;
  __mbstate_t local_8;
  
  pVar4._M_state = local_8;
  pVar4._M_off = local_10;
  pVar1._M_state = local_8;
  pVar1._M_off = local_10;
  if ((in_RSI == 0) && (in_EDX == _S_app)) {
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                        *)0x4238c0);
    if (bVar2) {
      pzVar3 = std::
               unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
               ::operator->((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                             *)0x4238e2);
      __off = (pzVar3->super_z_stream).total_out;
      std::streambuf::in_avail();
      std::fpos<__mbstate_t>::fpos(in_RDI,__off);
    }
    else {
      std::fpos<__mbstate_t>::fpos(in_RDI,in_stack_ffffffffffffffc8);
      pVar4 = pVar1;
    }
  }
  else {
    pVar4 = (pos_type)std::streambuf::seekoff((long)in_RDI,(_Ios_Seekdir)in_RSI,in_EDX);
  }
  return pVar4;
}

Assistant:

pos_type seekoff(off_type off, std::ios_base::seekdir dir,
                   std::ios_base::openmode which) override {
    if (off != 0 || dir != std::ios_base::cur) {
      return std::streambuf::seekoff(off, dir, which);
    }

    if (!zstrm_p) {
      return 0;
    }

    return static_cast<long int>(zstrm_p->total_out -
                                 static_cast<uLong>(in_avail()));
  }